

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool __thiscall
ON_2dVector::IsPerpendicularTo(ON_2dVector *this,ON_2dVector *v,double angle_tolerance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar5 = Length(this);
  dVar6 = Length(v);
  if ((0.0 < dVar6 * dVar5) &&
     (dVar1 = this->x, dVar2 = this->y, dVar3 = v->y, dVar4 = v->x, dVar7 = sin(angle_tolerance),
     ABS((dVar1 * dVar4 + dVar2 * dVar3) / (dVar6 * dVar5)) <= dVar7)) {
    return true;
  }
  return false;
}

Assistant:

bool ON_2dVector::IsPerpendicularTo(
      // returns true:  this and other vectors are perpendicular
      //         false: this and other vectors are not perpendicular
      //                or at least one of the vectors is zero
      const ON_2dVector& v,
      double angle_tolerance // (default=ON_DEFAULT_ANGLE_TOLERANCE) radians
      ) const
{
  bool rc = false;
  const double ll = Length()*v.Length();
  if ( ll > 0.0 ) {
    if ( fabs((x*v.x + y*v.y)/ll) <= sin(angle_tolerance) )
      rc = true;
  }
  return rc;
}